

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarCase::createInstance
          (ComputeBuiltinVarCase *this,Context *context)

{
  ComputeBuiltinVarInstance *this_00;
  Context *context_local;
  ComputeBuiltinVarCase *this_local;
  
  this_00 = (ComputeBuiltinVarInstance *)operator_new(0x58);
  ComputeBuiltinVarInstance::ComputeBuiltinVarInstance
            (this_00,context,&this->m_subCases,this->m_varType,this);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance*			createInstance			(Context& context) const
	{
		return new ComputeBuiltinVarInstance(context, m_subCases, m_varType, this);
	}